

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O1

int archive_write_zip_set_compression_store(archive *_a)

{
  long lVar1;
  int iVar2;
  int iVar3;
  
  lVar1 = *(long *)&_a[1].current_codepage;
  iVar2 = __archive_check_magic(_a,0xb0c5c0de,7,"archive_write_zip_set_compression_deflate");
  iVar3 = -0x1e;
  if (iVar2 != -0x1e) {
    if (_a->archive_format == 0x50000) {
      *(undefined4 *)(lVar1 + 200) = 0;
      iVar3 = 0;
    }
    else {
      archive_set_error(_a,-1,"Can only use archive_write_zip_set_compression_store with zip format"
                       );
    }
  }
  return iVar3;
}

Assistant:

int
archive_write_zip_set_compression_store(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct zip *zip = a->format_data;
	int ret = ARCHIVE_FAILED;

	archive_check_magic(_a, ARCHIVE_WRITE_MAGIC,
		ARCHIVE_STATE_NEW | ARCHIVE_STATE_HEADER | ARCHIVE_STATE_DATA,
		"archive_write_zip_set_compression_deflate");
	if (a->archive.archive_format != ARCHIVE_FORMAT_ZIP) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			"Can only use archive_write_zip_set_compression_store"
			" with zip format");
		ret = ARCHIVE_FATAL;
	} else {
		zip->requested_compression = COMPRESSION_STORE;
		ret = ARCHIVE_OK;
	}
	return (ret);
}